

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterNaive::BeginStep
          (SscWriterNaive *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  Buffer *in_RDI;
  size_t in_stack_000000a8;
  Buffer *in_stack_000000b0;
  
  in_RDI[3].m_Size = in_RDI[3].m_Size + 1;
  Buffer::clear(in_RDI);
  Buffer::resize(in_stack_000000b0,in_stack_000000a8);
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::clear((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           *)0x1d652e);
  return OK;
}

Assistant:

StepStatus SscWriterNaive::BeginStep(const StepMode mode, const float timeoutSeconds,
                                     const bool writerLocked)
{
    ++m_CurrentStep;

    m_Buffer.clear();
    m_Buffer.resize(16);
    m_Metadata.clear();

    return StepStatus::OK;
}